

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType1Tracer.cpp
# Opt level: O0

EStatusCode __thiscall
CharStringType1Tracer::Type1Pop
          (CharStringType1Tracer *this,LongList *inOperandList,LongList *inPostScriptOperandStack)

{
  allocator<char> local_41;
  string local_40;
  LongList *local_20;
  LongList *inPostScriptOperandStack_local;
  LongList *inOperandList_local;
  CharStringType1Tracer *this_local;
  
  local_20 = inPostScriptOperandStack;
  inPostScriptOperandStack_local = inOperandList;
  inOperandList_local = (LongList *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"pop",&local_41);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return eSuccess;
}

Assistant:

EStatusCode CharStringType1Tracer::Type1Pop(const LongList& inOperandList,const LongList& inPostScriptOperandStack)
{
	mPrimitiveWriter.WriteKeyword("pop");
	return PDFHummus::eSuccess;
}